

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::SolverState::SolverState(SolverState *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SolverState_0071c6e0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->history_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->history_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->history_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->history_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (SolverState *)&_SolverState_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  (this->learned_net_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->iter_ = 0;
  this->current_step_ = 0;
  return;
}

Assistant:

SolverState::SolverState()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.SolverState)
}